

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O3

void __thiscall DBOPL::Operator::Write20(Operator *this,Chip *chip,Bit8u val)

{
  Bit32u BVar1;
  Bit32u BVar2;
  byte bVar3;
  uint uVar4;
  byte bVar5;
  
  if (this->reg20 != val) {
    bVar5 = this->reg20 ^ val;
    this->reg20 = val;
    this->tremoloMask = (char)val >> 7;
    bVar3 = val;
    if ((bVar5 & 0x10) != 0) {
      UpdateRates(this,chip);
      bVar3 = this->reg20;
    }
    this->rateZero = (this->releaseAdd == 0 | (bVar3 & 0x20) >> 5) << 2 | this->rateZero & 0xfb;
    if ((bVar5 & 0x4f) != 0) {
      BVar1 = chip->freqMul[val & 0xf];
      this->freqMul = BVar1;
      uVar4 = this->chanData & 0x3ff;
      bVar5 = (byte)(this->chanData >> 10);
      this->waveAdd = (uVar4 << (bVar5 & 0x1f)) * BVar1;
      uVar4 = uVar4 >> 7;
      BVar2 = 0;
      if ((bVar3 & 0x40) != 0) {
        BVar2 = (uVar4 << (bVar5 & 0x1f)) * BVar1;
      }
      this->vibStrength = (byte)uVar4 & (char)(bVar3 * '\x02') >> 7;
      this->vibrato = BVar2;
    }
  }
  return;
}

Assistant:

void Operator::Write20( const Chip* chip, Bit8u val ) {
	Bit8u change = (reg20 ^ val );
	if ( !change )
		return;
	reg20 = val;
	//Shift the tremolo bit over the entire register, saved a branch, YES!
	tremoloMask = (Bit8s)(val) >> 7;
	tremoloMask &= ~(( 1 << ENV_EXTRA ) -1);
	//Update specific features based on changes
	if ( change & MASK_KSR ) {
		UpdateRates( chip );
	}
	//With sustain enable the volume doesn't change
	if ( reg20 & MASK_SUSTAIN || ( !releaseAdd ) ) {
		rateZero |= ( 1 << SUSTAIN );
	} else {
		rateZero &= ~( 1 << SUSTAIN );
	}
	//Frequency multiplier or vibrato changed
	if ( change & (0xf | MASK_VIBRATO) ) {
		freqMul = chip->freqMul[ val & 0xf ];
		UpdateFrequency();
	}
}